

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O2

Error * ot::commissioner::CommissionerImpl::EncodeChannelMask
                  (Error *__return_storage_ptr__,ByteArray *aBuf,ChannelMask *aChannelMask)

{
  char cVar1;
  pointer pCVar2;
  char *from;
  char *to;
  pointer pCVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  string_view fmt;
  writer write;
  string local_b0;
  undefined1 local_90 [40];
  format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  pCVar3 = (aChannelMask->
           super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (aChannelMask->
           super__Vector_base<ot::commissioner::ChannelMaskEntry,_std::allocator<ot::commissioner::ChannelMaskEntry>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (pCVar3 == pCVar2) {
      return __return_storage_ptr__;
    }
    if (0xfe < (ulong)((long)(pCVar3->mMasks).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(pCVar3->mMasks).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start)) break;
    utils::Encode<unsigned_char>(aBuf,pCVar3->mPage);
    utils::Encode<unsigned_char>
              (aBuf,(char)*(undefined4 *)
                           &(pCVar3->mMasks).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                    (char)*(undefined4 *)
                           &(pCVar3->mMasks).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)aBuf,
               (const_iterator)
               (aBuf->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(pCVar3->mMasks).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )(pCVar3->mMasks).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
    pCVar3 = pCVar3 + 1;
  }
  local_68.types_[0] = uint_type;
  from = "Channel Mask list is tool long (>={})";
  local_68.context_.super_basic_format_parse_context<char>.format_str_.data_ =
       "Channel Mask list is tool long (>={})";
  local_68.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x25;
  local_68.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
  local_68.context_.super_basic_format_parse_context<char>._20_4_ = 1;
  local_68.parse_funcs_[0] =
       ::fmt::v10::detail::
       parse_format_specs<unsigned_char,fmt::v10::detail::compile_parse_context<char>>;
  write.handler_ = &local_68;
  local_68.context_.types_ = local_68.types_;
  do {
    if (from == "") {
LAB_0019d765:
      local_68.types_[0] = 0xff;
      local_68._4_4_ = 0;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&local_68;
      fmt.size_ = 2;
      fmt.data_ = (char *)0x25;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_b0,(v10 *)"Channel Mask list is tool long (>={})",fmt,args);
      local_90._0_4_ = kInvalidArgs;
      std::__cxx11::string::string((string *)(local_90 + 8),(string *)&local_b0);
      Error::operator=(__return_storage_ptr__,(Error *)local_90);
      std::__cxx11::string::~string((string *)(local_90 + 8));
      std::__cxx11::string::~string((string *)&local_b0);
      return __return_storage_ptr__;
    }
    cVar1 = *from;
    to = from;
    while (cVar1 != '{') {
      to = to + 1;
      if (to == "") {
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>
        ::writer::operator()(&write,from,"");
        goto LAB_0019d765;
      }
      cVar1 = *to;
    }
    ::fmt::v10::detail::
    parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_char>_>::
    writer::operator()(&write,from,to);
    from = ::fmt::v10::detail::
           parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_char>&>
                     (to,"",&local_68);
  } while( true );
}

Assistant:

Error CommissionerImpl::EncodeChannelMask(ByteArray &aBuf, const ChannelMask &aChannelMask)
{
    Error error;

    for (const auto &entry : aChannelMask)
    {
        VerifyOrExit(entry.mMasks.size() < tlv::kEscapeLength,
                     error = ERROR_INVALID_ARGS("Channel Mask list is tool long (>={})", tlv::kEscapeLength));

        utils::Encode(aBuf, entry.mPage);
        utils::Encode(aBuf, static_cast<uint8_t>(entry.mMasks.size()));
        aBuf.insert(aBuf.end(), entry.mMasks.begin(), entry.mMasks.end());
    }

exit:
    return error;
}